

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preEnd__profile_GLSL__technique__pass__alpha_func__func(ColladaParserAutoGen14Private *this)

{
  ColladaParserAutoGen14Private *this_local;
  
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preEnd__profile_GLSL__technique__pass__alpha_func__func()
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateEnd__profile_GLSL__technique__pass__alpha_func__func();
        if ( !validationResult ) return false;

    } // validation
#endif

    return true;
}